

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDVertex::ClearFaceMarks(ON_SubDVertex *this)

{
  bool bVar1;
  unsigned_short vfi;
  ulong uVar2;
  
  bVar1 = true;
  for (uVar2 = 0; uVar2 < this->m_face_count; uVar2 = uVar2 + 1) {
    if (this->m_faces[uVar2] == (ON_SubDFace *)0x0) {
      bVar1 = false;
    }
    else {
      ON_ComponentStatus::ClearRuntimeMark
                (&(this->m_faces[uVar2]->super_ON_SubDComponentBase).m_status);
    }
  }
  return bVar1;
}

Assistant:

bool ON_SubDVertex::ClearFaceMarks() const
{
  bool rc = true;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr == f)
      rc = false;
    else
      f->m_status.ClearRuntimeMark();
  }
  return rc;
}